

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O0

void __thiscall RedBlackTree::leftRotate(RedBlackTree *this,Node **ptr)

{
  Node *pNVar1;
  Node *right_child;
  Node **ptr_local;
  RedBlackTree *this_local;
  
  pNVar1 = (*ptr)->right;
  (*ptr)->right = pNVar1->left;
  if ((*ptr)->right != (Node *)0x0) {
    (*ptr)->right->parent = *ptr;
  }
  pNVar1->parent = (*ptr)->parent;
  if ((*ptr)->parent == (Node *)0x0) {
    this->root = pNVar1;
  }
  else if (*ptr == (*ptr)->parent->left) {
    (*ptr)->parent->left = pNVar1;
  }
  else {
    (*ptr)->parent->right = pNVar1;
  }
  pNVar1->left = *ptr;
  (*ptr)->parent = pNVar1;
  return;
}

Assistant:

void RedBlackTree::leftRotate(Node *&ptr) {
    Node *right_child = ptr->right;
    ptr->right = right_child->left;

    if (ptr->right != nullptr) {
        ptr->right->parent = ptr;
    }
    right_child->parent = ptr->parent;

    if (ptr->parent == nullptr) {
        root = right_child;
    } else if (ptr == ptr->parent->left) {
        ptr->parent->left = right_child;
    } else {
        ptr->parent->right = right_child;
    }

    right_child->left = ptr;
    ptr->parent = right_child;
}